

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O3

void duckdb::StringStats::Merge(BaseStatistics *stats,BaseStatistics *other)

{
  LogicalTypeId LVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  undefined1 uVar5;
  long lVar6;
  uint uVar7;
  bool bVar8;
  
  LVar1 = (other->type).id_;
  if ((LVar1 != SQLNULL) && (LVar1 != VALIDITY)) {
    lVar6 = 0;
    while( true ) {
      bVar2 = *(byte *)((long)&other->stats_union + lVar6);
      bVar3 = *(byte *)((long)&stats->stats_union + lVar6);
      if (bVar2 < bVar3) break;
      if ((bVar2 >= bVar3 && bVar2 != bVar3) || (bVar8 = lVar6 == 7, lVar6 = lVar6 + 1, bVar8))
      goto LAB_005ef56e;
    }
    *(undefined8 *)(stats->stats_union).string_data.min =
         *(undefined8 *)(other->stats_union).string_data.min;
LAB_005ef56e:
    lVar6 = 0;
    do {
      bVar2 = *(byte *)((long)&stats->stats_union + lVar6 + 8);
      bVar3 = *(byte *)((long)&other->stats_union + lVar6 + 8);
      if (bVar3 < bVar2) break;
      if (bVar3 >= bVar2 && bVar3 != bVar2) {
        *(undefined8 *)((long)&stats->stats_union + 8) =
             *(undefined8 *)((long)&other->stats_union + 8);
        break;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    uVar5 = true;
    if ((stats->stats_union).string_data.has_unicode == false) {
      uVar5 = (undefined1)*(undefined4 *)((long)&other->stats_union + 0x10);
    }
    (stats->stats_union).string_data.has_unicode = (bool)uVar5;
    bVar8 = false;
    if ((stats->stats_union).string_data.has_max_string_length != false) {
      bVar8 = (other->stats_union).string_data.has_max_string_length;
    }
    (stats->stats_union).string_data.has_max_string_length = bVar8;
    uVar4 = (stats->stats_union).string_data.max_string_length;
    uVar7 = (other->stats_union).string_data.max_string_length;
    if (uVar7 < uVar4) {
      uVar7 = uVar4;
    }
    (stats->stats_union).string_data.max_string_length = uVar7;
  }
  return;
}

Assistant:

inline LogicalTypeId id() const { // NOLINT: mimic std casing
		return id_;
	}